

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR CorUnix::CPalSynchronizationManager::DelegateSignalingToRemoteProcess
                    (CPalThread *pthrCurrent,DWORD dwTargetProcessId,SHMPTR shridSynchData)

{
  CSynchData *this;
  long in_FS_OFFSET;
  CSynchData *psdSynchData;
  BYTE *pBStack_58;
  DWORD dwSigCount;
  BYTE *pbyDst;
  BYTE *pbySrc;
  int local_40;
  PAL_ERROR palErr;
  int i;
  int MsgSize;
  SHMPTR shridSynchData_local;
  CPalThread *pCStack_28;
  DWORD dwTargetProcessId_local;
  CPalThread *pthrCurrent_local;
  BYTE rgSendBuf [13];
  
  rgSendBuf._5_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  palErr = 0xd;
  pbySrc._4_4_ = 0;
  pBStack_58 = (BYTE *)((long)&pthrCurrent_local + 3);
  _i = shridSynchData;
  shridSynchData_local._4_4_ = dwTargetProcessId;
  pCStack_28 = pthrCurrent;
  this = (CSynchData *)SHMPtrToPtr(shridSynchData);
  if (gPID == shridSynchData_local._4_4_) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x98f);
    fprintf(_stderr,"Expression: gPID != dwTargetProcessId, Description:  called on local thread\n")
    ;
  }
  if (_i == 0) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x990);
    fprintf(_stderr,
            "Expression: NULLSharedID != shridSynchData, Description: NULL shared identifier\n");
  }
  if (this == (CSynchData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x993);
    fprintf(_stderr,
            "Expression: NULL != psdSynchData, Description: Bad shared SynchData identifier (%p)\n",
            _i);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  psdSynchData._4_4_ = CSynchData::GetSignalCount(this);
  CSynchData::AddRef(this);
  *pBStack_58 = '\x02';
  pbyDst = (BYTE *)&i;
  for (local_40 = 0; pBStack_58 = pBStack_58 + 1, local_40 < 8; local_40 = local_40 + 1) {
    *pBStack_58 = *pbyDst;
    pbyDst = pbyDst + 1;
  }
  pbyDst = (BYTE *)((long)&psdSynchData + 4);
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    *pBStack_58 = *pbyDst;
    pBStack_58 = pBStack_58 + 1;
    pbyDst = pbyDst + 1;
  }
  if (rgSendBuf + 6 < pBStack_58) {
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x9b7);
    fprintf(_stderr,"Expression: pbyDst <= rgSendBuf + MsgSize + 1, Description: Buffer overrun");
  }
  pbySrc._4_4_ = SendMsgToRemoteWorker
                           (shridSynchData_local._4_4_,(BYTE *)((long)&pthrCurrent_local + 3),0xd);
  if (pbySrc._4_4_ != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CSynchData::Release(this,pCStack_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != rgSendBuf._5_8_) {
    __stack_chk_fail();
  }
  return pbySrc._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::DelegateSignalingToRemoteProcess(
        CPalThread * pthrCurrent,
        DWORD dwTargetProcessId,
        SharedID shridSynchData)
    {
        const int MsgSize = sizeof(BYTE) + sizeof(SharedID) + sizeof(DWORD);
        int i;
        PAL_ERROR palErr = NO_ERROR;
        BYTE rgSendBuf[MsgSize];
        BYTE * pbySrc, * pbyDst = rgSendBuf;
        DWORD dwSigCount;
        CSynchData * psdSynchData =
            SharedIDToTypePointer(CSynchData, shridSynchData);

        _ASSERT_MSG(gPID != dwTargetProcessId,
                    " called on local thread\n");
        _ASSERT_MSG(NULLSharedID != shridSynchData, "NULL shared identifier\n");
        _ASSERT_MSG(NULL != psdSynchData,
                    "Bad shared SynchData identifier (%p)\n",
                    (VOID*)shridSynchData);
        _ASSERT_MSG(MsgSize <= PIPE_BUF,
                    "Message too long [MsgSize=%d PIPE_BUF=%d]\n",
                    MsgSize, (int)PIPE_BUF);

        TRACE("Transfering wait all signaling to remote process pid=%x "
              "by sending cmd=%u and shridSynchData=%p over process pipe\n",
              dwTargetProcessId, SynchWorkerCmdDelegatedObjectSignaling,
              (VOID *)shridSynchData);

        dwSigCount = psdSynchData->GetSignalCount();

        // AddRef SynchData to be marshaled to remote process
        psdSynchData->AddRef();

        //
        // Prepare the message
        //

        // Cmd
        *pbyDst++ = (BYTE)(SynchWorkerCmdDelegatedObjectSignaling & 0xFF);

        // CSynchData (not aligned, copy byte by byte)
        pbySrc = (BYTE *)&shridSynchData;
        for (i=0; i<(int)sizeof(SharedID); i++)
        {
            *pbyDst++ = *pbySrc++;
        }

        // Signal Count (not aligned, copy byte by byte)
        pbySrc = (BYTE *)&dwSigCount;
        for (i=0; i<(int)sizeof(DWORD); i++)
        {
            *pbyDst++ = *pbySrc++;
        }

        _ASSERT_MSG(pbyDst <= rgSendBuf + MsgSize + 1, "Buffer overrun");

        // Send the message
        palErr = SendMsgToRemoteWorker(dwTargetProcessId, rgSendBuf,
                                       MsgSize);
        if (NO_ERROR != palErr)
        {
            TRACE("Failed sending message to remote worker in process %u\n",
                  dwTargetProcessId);
            // Undo refcounting
            psdSynchData->Release(pthrCurrent);
            goto WUT_exit;
        }

    WUT_exit:
        return palErr;
    }